

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong unaff_RBX;
  size_t mask;
  NodeRef *pNVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  byte bVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  size_t local_14e0;
  ulong local_14d8;
  ulong local_14d0;
  NodeRef *local_14c8;
  Scene *local_14c0;
  ulong local_14b8;
  ulong local_14b0;
  RTCFilterFunctionNArguments args;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [32];
  undefined1 local_1308 [32];
  undefined1 local_12e8 [32];
  undefined1 local_12c8 [32];
  undefined1 local_12a8 [32];
  undefined1 local_1288 [32];
  RTCHitN local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  uint local_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  uint uStack_11e0;
  uint uStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar65 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar66 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar67 = ZEXT3264(auVar51);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 0.99999964)));
  auVar68 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar69 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar70 = ZEXT3264(auVar51);
  auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 1.0000004)));
  auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 1.0000004)));
  auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_14b0 = uVar20 ^ 0x20;
  auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  local_14b8 = uVar17 ^ 0x20;
  auVar13 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  pNVar18 = stack + 1;
  do {
    local_14c8 = pNVar18;
    if (local_14c8 == stack) break;
    pNVar18 = local_14c8 + -1;
    sVar22 = local_14c8[-1].ptr;
    do {
      if ((sVar22 & 8) == 0) {
        uVar15 = sVar22 & 0xfffffffffffffff0;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar60._4_4_ = uVar5;
        auVar60._0_4_ = uVar5;
        auVar60._8_4_ = uVar5;
        auVar60._12_4_ = uVar5;
        auVar60._16_4_ = uVar5;
        auVar60._20_4_ = uVar5;
        auVar60._24_4_ = uVar5;
        auVar60._28_4_ = uVar5;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar19),auVar60,
                                  *(undefined1 (*) [32])(uVar15 + 0x40 + uVar19));
        auVar56 = vsubps_avx512vl(ZEXT1632(auVar50),auVar65._0_32_);
        auVar56 = vmulps_avx512vl(auVar68._0_32_,auVar56);
        auVar57 = vmaxps_avx512vl(auVar54,auVar56);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar20),auVar60,
                                  *(undefined1 (*) [32])(uVar15 + 0x40 + uVar20));
        auVar56 = vsubps_avx512vl(ZEXT1632(auVar50),auVar66._0_32_);
        auVar56 = vmulps_avx512vl(auVar69._0_32_,auVar56);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar17),auVar60,
                                  *(undefined1 (*) [32])(uVar15 + 0x40 + uVar17));
        auVar58 = vsubps_avx512vl(ZEXT1632(auVar50),auVar67._0_32_);
        auVar58 = vmulps_avx512vl(auVar70._0_32_,auVar58);
        auVar56 = vmaxps_avx(auVar56,auVar58);
        auVar56 = vmaxps_avx(auVar57,auVar56);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar19 ^ 0x20)),auVar60,
                                  *(undefined1 (*) [32])(uVar15 + 0x40 + (uVar19 ^ 0x20)));
        auVar57 = vsubps_avx512vl(ZEXT1632(auVar50),auVar65._0_32_);
        auVar57 = vmulps_avx512vl(auVar51,auVar57);
        auVar58 = vminps_avx512vl(auVar55,auVar57);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + local_14b0),auVar60,
                                  *(undefined1 (*) [32])(uVar15 + 0x40 + local_14b0));
        auVar57 = vsubps_avx512vl(ZEXT1632(auVar50),auVar66._0_32_);
        auVar57 = vmulps_avx512vl(auVar52,auVar57);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + local_14b8),auVar60,
                                  *(undefined1 (*) [32])(uVar15 + 0x40 + local_14b8));
        auVar59 = vsubps_avx512vl(ZEXT1632(auVar50),auVar67._0_32_);
        auVar59 = vmulps_avx512vl(auVar53,auVar59);
        auVar57 = vminps_avx(auVar57,auVar59);
        auVar57 = vminps_avx(auVar58,auVar57);
        if (((uint)sVar22 & 7) == 6) {
          uVar11 = vcmpps_avx512vl(auVar56,auVar57,2);
          uVar10 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [32])(uVar15 + 0x1c0),0xd);
          uVar12 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
          bVar26 = (byte)uVar11 & (byte)uVar10 & (byte)uVar12;
        }
        else {
          uVar11 = vcmpps_avx512vl(auVar56,auVar57,2);
          bVar26 = (byte)uVar11;
        }
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar26);
      }
      if ((sVar22 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar23 = 4;
        }
        else {
          uVar21 = sVar22 & 0xfffffffffffffff0;
          lVar16 = 0;
          for (uVar15 = unaff_RBX; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar23 = 0;
          for (uVar15 = unaff_RBX - 1 & unaff_RBX; sVar22 = *(size_t *)(uVar21 + lVar16 * 8),
              uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
            pNVar18->ptr = sVar22;
            pNVar18 = pNVar18 + 1;
            lVar16 = 0;
            for (uVar14 = uVar15; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
          }
        }
      }
      else {
        uVar23 = 6;
      }
    } while (uVar23 == 0);
    if (uVar23 == 6) {
      uVar23 = 0;
      local_14d8 = (ulong)((uint)sVar22 & 0xf) - 8;
      bVar24 = local_14d8 != 0;
      if (bVar24) {
        uVar15 = sVar22 & 0xfffffffffffffff0;
        local_14d0 = 0;
        do {
          lVar16 = local_14d0 * 0x140;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar37._4_4_ = uVar5;
          auVar37._0_4_ = uVar5;
          auVar37._8_4_ = uVar5;
          auVar37._12_4_ = uVar5;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x90 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + lVar16));
          auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xa0 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x10 + lVar16));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xb0 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x20 + lVar16));
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xc0 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x30 + lVar16));
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xd0 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x40 + lVar16));
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xe0 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x50 + lVar16));
          auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xf0 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x60 + lVar16));
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x100 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x70 + lVar16));
          auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x110 + lVar16),auVar37,
                                    *(undefined1 (*) [16])(uVar15 + 0x80 + lVar16));
          uVar5 = *(undefined4 *)(ray + k * 4);
          auVar38._4_4_ = uVar5;
          auVar38._0_4_ = uVar5;
          auVar38._8_4_ = uVar5;
          auVar38._12_4_ = uVar5;
          auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar61._4_4_ = uVar5;
          auVar61._0_4_ = uVar5;
          auVar61._8_4_ = uVar5;
          auVar61._12_4_ = uVar5;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar63._4_4_ = uVar5;
          auVar63._0_4_ = uVar5;
          auVar63._8_4_ = uVar5;
          auVar63._12_4_ = uVar5;
          fVar2 = *(float *)(ray + k * 4 + 0x60);
          auVar64._4_4_ = fVar2;
          auVar64._0_4_ = fVar2;
          auVar64._8_4_ = fVar2;
          auVar64._12_4_ = fVar2;
          auVar50 = vsubps_avx(auVar50,auVar38);
          auVar30 = vsubps_avx512vl(auVar49,auVar28);
          auVar31 = vsubps_avx512vl(auVar44,auVar29);
          auVar32 = vsubps_avx512vl(auVar32,auVar38);
          auVar33 = vsubps_avx512vl(auVar33,auVar28);
          auVar34 = vsubps_avx512vl(auVar34,auVar29);
          auVar35 = vsubps_avx512vl(auVar35,auVar38);
          auVar36 = vsubps_avx512vl(auVar36,auVar28);
          auVar37 = vsubps_avx512vl(auVar37,auVar29);
          auVar28 = vsubps_avx512vl(auVar35,auVar50);
          auVar49 = vsubps_avx(auVar36,auVar30);
          auVar29 = vsubps_avx512vl(auVar37,auVar31);
          auVar38 = vsubps_avx512vl(auVar50,auVar32);
          auVar39 = vsubps_avx512vl(auVar30,auVar33);
          auVar40 = vsubps_avx512vl(auVar31,auVar34);
          auVar41 = vsubps_avx512vl(auVar32,auVar35);
          auVar42 = vsubps_avx512vl(auVar33,auVar36);
          auVar43 = vsubps_avx512vl(auVar34,auVar37);
          auVar44 = vaddps_avx512vl(auVar35,auVar50);
          auVar62._0_4_ = auVar36._0_4_ + auVar30._0_4_;
          auVar62._4_4_ = auVar36._4_4_ + auVar30._4_4_;
          auVar62._8_4_ = auVar36._8_4_ + auVar30._8_4_;
          auVar62._12_4_ = auVar36._12_4_ + auVar30._12_4_;
          auVar45 = vaddps_avx512vl(auVar37,auVar31);
          auVar46 = vmulps_avx512vl(auVar62,auVar29);
          auVar46 = vfmsub231ps_avx512vl(auVar46,auVar49,auVar45);
          auVar45 = vmulps_avx512vl(auVar45,auVar28);
          auVar45 = vfmsub231ps_avx512vl(auVar45,auVar29,auVar44);
          auVar47._0_4_ = auVar49._0_4_ * auVar44._0_4_;
          auVar47._4_4_ = auVar49._4_4_ * auVar44._4_4_;
          auVar47._8_4_ = auVar49._8_4_ * auVar44._8_4_;
          auVar47._12_4_ = auVar49._12_4_ * auVar44._12_4_;
          auVar44 = vfmsub231ps_fma(auVar47,auVar28,auVar62);
          auVar48._0_4_ = fVar2 * auVar44._0_4_;
          auVar48._4_4_ = fVar2 * auVar44._4_4_;
          auVar48._8_4_ = fVar2 * auVar44._8_4_;
          auVar48._12_4_ = fVar2 * auVar44._12_4_;
          auVar44 = vfmadd231ps_avx512vl(auVar48,auVar63,auVar45);
          auVar45 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar46);
          auVar44 = vaddps_avx512vl(auVar50,auVar32);
          auVar46 = vaddps_avx512vl(auVar30,auVar33);
          auVar47 = vaddps_avx512vl(auVar31,auVar34);
          auVar48 = vmulps_avx512vl(auVar46,auVar40);
          auVar48 = vfmsub231ps_avx512vl(auVar48,auVar39,auVar47);
          auVar47 = vmulps_avx512vl(auVar47,auVar38);
          auVar47 = vfmsub231ps_avx512vl(auVar47,auVar40,auVar44);
          auVar44 = vmulps_avx512vl(auVar44,auVar39);
          auVar44 = vfmsub231ps_avx512vl(auVar44,auVar38,auVar46);
          auVar46._0_4_ = fVar2 * auVar44._0_4_;
          auVar46._4_4_ = fVar2 * auVar44._4_4_;
          auVar46._8_4_ = fVar2 * auVar44._8_4_;
          auVar46._12_4_ = fVar2 * auVar44._12_4_;
          auVar44 = vfmadd231ps_avx512vl(auVar46,auVar63,auVar47);
          auVar46 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar48);
          auVar44 = vaddps_avx512vl(auVar32,auVar35);
          auVar32 = vaddps_avx512vl(auVar33,auVar36);
          auVar33 = vaddps_avx512vl(auVar34,auVar37);
          auVar34 = vmulps_avx512vl(auVar32,auVar43);
          auVar34 = vfmsub231ps_avx512vl(auVar34,auVar42,auVar33);
          auVar33 = vmulps_avx512vl(auVar33,auVar41);
          auVar33 = vfmsub231ps_avx512vl(auVar33,auVar43,auVar44);
          auVar44 = vmulps_avx512vl(auVar44,auVar42);
          auVar44 = vfmsub231ps_avx512vl(auVar44,auVar41,auVar32);
          auVar44 = vmulps_avx512vl(auVar44,auVar64);
          auVar44 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar33);
          auVar34 = vfmadd231ps_avx512vl(auVar44,auVar61,auVar34);
          auVar35._0_4_ = auVar45._0_4_ + auVar46._0_4_;
          auVar35._4_4_ = auVar45._4_4_ + auVar46._4_4_;
          auVar35._8_4_ = auVar45._8_4_ + auVar46._8_4_;
          auVar35._12_4_ = auVar45._12_4_ + auVar46._12_4_;
          auVar35 = vaddps_avx512vl(auVar34,auVar35);
          auVar44._8_4_ = 0x7fffffff;
          auVar44._0_8_ = 0x7fffffff7fffffff;
          auVar44._12_4_ = 0x7fffffff;
          auVar44 = vandps_avx512vl(auVar35,auVar44);
          auVar32._8_4_ = 0x34000000;
          auVar32._0_8_ = 0x3400000034000000;
          auVar32._12_4_ = 0x34000000;
          auVar32 = vmulps_avx512vl(auVar44,auVar32);
          auVar33 = vminps_avx512vl(auVar45,auVar46);
          auVar36 = vminps_avx512vl(auVar33,auVar34);
          auVar33._8_4_ = 0x80000000;
          auVar33._0_8_ = 0x8000000080000000;
          auVar33._12_4_ = 0x80000000;
          auVar33 = vxorps_avx512vl(auVar32,auVar33);
          uVar11 = vcmpps_avx512vl(auVar36,auVar33,5);
          auVar33 = vmaxps_avx512vl(auVar45,auVar46);
          auVar33 = vmaxps_avx512vl(auVar33,auVar34);
          uVar10 = vcmpps_avx512vl(auVar33,auVar32,2);
          bVar26 = ((byte)uVar11 | (byte)uVar10) & 0xf;
          if (bVar26 != 0) {
            auVar32 = vmulps_avx512vl(auVar39,auVar29);
            auVar33 = vmulps_avx512vl(auVar28,auVar40);
            auVar34 = vmulps_avx512vl(auVar38,auVar49);
            auVar36 = vmulps_avx512vl(auVar42,auVar40);
            auVar37 = vmulps_avx512vl(auVar38,auVar43);
            auVar47 = vmulps_avx512vl(auVar41,auVar39);
            auVar49 = vfmsub213ps_avx512vl(auVar49,auVar40,auVar32);
            auVar29 = vfmsub213ps_avx512vl(auVar29,auVar38,auVar33);
            auVar28 = vfmsub213ps_avx512vl(auVar28,auVar39,auVar34);
            auVar39 = vfmsub213ps_avx512vl(auVar43,auVar39,auVar36);
            auVar40 = vfmsub213ps_avx512vl(auVar41,auVar40,auVar37);
            auVar38 = vfmsub213ps_avx512vl(auVar42,auVar38,auVar47);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar32 = vandps_avx512vl(auVar32,auVar41);
            auVar36 = vandps_avx512vl(auVar36,auVar41);
            uVar21 = vcmpps_avx512vl(auVar32,auVar36,1);
            auVar32 = vandps_avx512vl(auVar33,auVar41);
            auVar33 = vandps_avx512vl(auVar37,auVar41);
            uVar14 = vcmpps_avx512vl(auVar32,auVar33,1);
            auVar32 = vandps_avx512vl(auVar34,auVar41);
            auVar33 = vandps_avx512vl(auVar47,auVar41);
            uVar27 = vcmpps_avx512vl(auVar32,auVar33,1);
            bVar25 = (bool)((byte)uVar21 & 1);
            local_1358._0_4_ = (uint)bVar25 * auVar49._0_4_ | (uint)!bVar25 * auVar39._0_4_;
            bVar25 = (bool)((byte)(uVar21 >> 1) & 1);
            local_1358._4_4_ = (uint)bVar25 * auVar49._4_4_ | (uint)!bVar25 * auVar39._4_4_;
            bVar25 = (bool)((byte)(uVar21 >> 2) & 1);
            local_1358._8_4_ = (uint)bVar25 * auVar49._8_4_ | (uint)!bVar25 * auVar39._8_4_;
            bVar25 = (bool)((byte)(uVar21 >> 3) & 1);
            local_1358._12_4_ = (uint)bVar25 * auVar49._12_4_ | (uint)!bVar25 * auVar39._12_4_;
            bVar25 = (bool)((byte)uVar14 & 1);
            local_1348._0_4_ = (uint)bVar25 * auVar29._0_4_ | (uint)!bVar25 * auVar40._0_4_;
            bVar25 = (bool)((byte)(uVar14 >> 1) & 1);
            local_1348._4_4_ = (uint)bVar25 * auVar29._4_4_ | (uint)!bVar25 * auVar40._4_4_;
            bVar25 = (bool)((byte)(uVar14 >> 2) & 1);
            local_1348._8_4_ = (uint)bVar25 * auVar29._8_4_ | (uint)!bVar25 * auVar40._8_4_;
            bVar25 = (bool)((byte)(uVar14 >> 3) & 1);
            local_1348._12_4_ = (uint)bVar25 * auVar29._12_4_ | (uint)!bVar25 * auVar40._12_4_;
            bVar25 = (bool)((byte)uVar27 & 1);
            local_1338._0_4_ = (float)((uint)bVar25 * auVar28._0_4_ | (uint)!bVar25 * auVar38._0_4_)
            ;
            bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
            local_1338._4_4_ = (float)((uint)bVar25 * auVar28._4_4_ | (uint)!bVar25 * auVar38._4_4_)
            ;
            bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
            local_1338._8_4_ = (float)((uint)bVar25 * auVar28._8_4_ | (uint)!bVar25 * auVar38._8_4_)
            ;
            bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
            local_1338._12_4_ =
                 (float)((uint)bVar25 * auVar28._12_4_ | (uint)!bVar25 * auVar38._12_4_);
            auVar29._0_4_ = fVar2 * local_1338._0_4_;
            auVar29._4_4_ = fVar2 * local_1338._4_4_;
            auVar29._8_4_ = fVar2 * local_1338._8_4_;
            auVar29._12_4_ = fVar2 * local_1338._12_4_;
            auVar49 = vfmadd213ps_fma(auVar63,local_1348,auVar29);
            auVar49 = vfmadd213ps_fma(auVar61,local_1358,auVar49);
            auVar36._0_4_ = auVar49._0_4_ + auVar49._0_4_;
            auVar36._4_4_ = auVar49._4_4_ + auVar49._4_4_;
            auVar36._8_4_ = auVar49._8_4_ + auVar49._8_4_;
            auVar36._12_4_ = auVar49._12_4_ + auVar49._12_4_;
            auVar28._0_4_ = auVar31._0_4_ * local_1338._0_4_;
            auVar28._4_4_ = auVar31._4_4_ * local_1338._4_4_;
            auVar28._8_4_ = auVar31._8_4_ * local_1338._8_4_;
            auVar28._12_4_ = auVar31._12_4_ * local_1338._12_4_;
            auVar49 = vfmadd213ps_fma(auVar30,local_1348,auVar28);
            auVar49 = vfmadd213ps_fma(auVar50,local_1358,auVar49);
            auVar32 = vrcp14ps_avx512vl(auVar36);
            auVar50._8_4_ = 0x3f800000;
            auVar50._0_8_ = &DAT_3f8000003f800000;
            auVar50._12_4_ = 0x3f800000;
            auVar50 = vfnmadd213ps_avx512vl(auVar32,auVar36,auVar50);
            auVar50 = vfmadd132ps_fma(auVar50,auVar32,auVar32);
            local_1368._0_4_ = auVar50._0_4_ * (auVar49._0_4_ + auVar49._0_4_);
            local_1368._4_4_ = auVar50._4_4_ * (auVar49._4_4_ + auVar49._4_4_);
            local_1368._8_4_ = auVar50._8_4_ * (auVar49._8_4_ + auVar49._8_4_);
            local_1368._12_4_ = auVar50._12_4_ * (auVar49._12_4_ + auVar49._12_4_);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar49._4_4_ = uVar5;
            auVar49._0_4_ = uVar5;
            auVar49._8_4_ = uVar5;
            auVar49._12_4_ = uVar5;
            uVar11 = vcmpps_avx512vl(local_1368,auVar49,2);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar34._4_4_ = uVar5;
            auVar34._0_4_ = uVar5;
            auVar34._8_4_ = uVar5;
            auVar34._12_4_ = uVar5;
            uVar10 = vcmpps_avx512vl(local_1368,auVar34,0xd);
            bVar26 = (byte)uVar11 & (byte)uVar10 & bVar26;
            if (bVar26 != 0) {
              uVar11 = vcmpps_avx512vl(auVar36,_DAT_01feba10,4);
              bVar26 = bVar26 & (byte)uVar11;
              if (bVar26 != 0) {
                local_14c0 = context->scene;
                auVar30._8_4_ = 0x219392ef;
                auVar30._0_8_ = 0x219392ef219392ef;
                auVar30._12_4_ = 0x219392ef;
                uVar21 = vcmpps_avx512vl(auVar44,auVar30,5);
                auVar49 = vrcp14ps_avx512vl(auVar35);
                auVar40._8_4_ = 0x3f800000;
                auVar40._0_8_ = &DAT_3f8000003f800000;
                auVar40._12_4_ = 0x3f800000;
                auVar50 = vfnmadd213ps_fma(auVar35,auVar49,auVar40);
                auVar50 = vfmadd132ps_avx512vl(auVar50,auVar49,auVar49);
                fVar2 = (float)((uint)((byte)uVar21 & 1) * auVar50._0_4_);
                fVar3 = (float)((uint)((byte)(uVar21 >> 1) & 1) * auVar50._4_4_);
                fVar4 = (float)((uint)((byte)(uVar21 >> 2) & 1) * auVar50._8_4_);
                fVar1 = (float)((uint)((byte)(uVar21 >> 3) & 1) * auVar50._12_4_);
                auVar31._0_4_ = fVar2 * auVar45._0_4_;
                auVar31._4_4_ = fVar3 * auVar45._4_4_;
                auVar31._8_4_ = fVar4 * auVar45._8_4_;
                auVar31._12_4_ = fVar1 * auVar45._12_4_;
                local_1388 = vminps_avx(auVar31,auVar40);
                auVar39._0_4_ = fVar2 * auVar46._0_4_;
                auVar39._4_4_ = fVar3 * auVar46._4_4_;
                auVar39._8_4_ = fVar4 * auVar46._8_4_;
                auVar39._12_4_ = fVar1 * auVar46._12_4_;
                local_1378 = vminps_avx(auVar39,auVar40);
                uVar21 = (ulong)bVar26;
                do {
                  uVar14 = 0;
                  for (uVar27 = uVar21; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000
                      ) {
                    uVar14 = uVar14 + 1;
                  }
                  pGVar8 = (local_14c0->geometries).items
                           [*(uint *)(lVar16 + uVar15 + 0x120 + uVar14 * 4)].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar21 = uVar21 ^ 1L << (uVar14 & 0x3f);
                    bVar25 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar25 = false;
                  }
                  else {
                    uVar27 = (ulong)(uint)((int)uVar14 * 4);
                    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar6 = *(undefined4 *)(local_1388 + uVar27);
                    local_1238._4_4_ = uVar6;
                    local_1238._0_4_ = uVar6;
                    local_1238._8_4_ = uVar6;
                    local_1238._12_4_ = uVar6;
                    uVar6 = *(undefined4 *)(local_1378 + uVar27);
                    local_1228._4_4_ = uVar6;
                    local_1228._0_4_ = uVar6;
                    local_1228._8_4_ = uVar6;
                    local_1228._12_4_ = uVar6;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1368 + uVar27);
                    args.context = context->user;
                    local_1208 = vpbroadcastd_avx512vl();
                    uVar6 = *(undefined4 *)(lVar16 + uVar15 + 0x130 + uVar27);
                    local_1218._4_4_ = uVar6;
                    local_1218._0_4_ = uVar6;
                    local_1218._8_4_ = uVar6;
                    local_1218._12_4_ = uVar6;
                    uVar6 = *(undefined4 *)(local_1358 + uVar27);
                    uVar7 = *(undefined4 *)(local_1348 + uVar27);
                    local_1258._4_4_ = uVar7;
                    local_1258._0_4_ = uVar7;
                    local_1258._8_4_ = uVar7;
                    local_1258._12_4_ = uVar7;
                    uVar7 = *(undefined4 *)(local_1338 + uVar27);
                    local_1248._4_4_ = uVar7;
                    local_1248._0_4_ = uVar7;
                    local_1248._8_4_ = uVar7;
                    local_1248._12_4_ = uVar7;
                    local_1268[0] = (RTCHitN)(char)uVar6;
                    local_1268[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_1268[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_1268[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    local_1268[4] = (RTCHitN)(char)uVar6;
                    local_1268[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_1268[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_1268[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    local_1268[8] = (RTCHitN)(char)uVar6;
                    local_1268[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_1268[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_1268[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    local_1268[0xc] = (RTCHitN)(char)uVar6;
                    local_1268[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_1268[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_1268[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_1208),ZEXT1632(local_1208));
                    uStack_11f4 = (args.context)->instID[0];
                    local_11f8 = uStack_11f4;
                    uStack_11f0 = uStack_11f4;
                    uStack_11ec = uStack_11f4;
                    uStack_11e8 = (args.context)->instPrimID[0];
                    uStack_11e4 = uStack_11e8;
                    uStack_11e0 = uStack_11e8;
                    uStack_11dc = uStack_11e8;
                    local_13f8 = auVar13._0_8_;
                    uStack_13f0 = auVar13._8_8_;
                    local_14f8 = local_13f8;
                    uStack_14f0 = uStack_13f0;
                    args.valid = (int *)&local_14f8;
                    args.geometryUserPtr = pGVar8->userPtr;
                    args.hit = local_1268;
                    args.N = 4;
                    local_1288 = auVar65._0_32_;
                    local_12a8 = auVar66._0_32_;
                    local_12c8 = auVar67._0_32_;
                    local_12e8 = auVar68._0_32_;
                    local_1308 = auVar69._0_32_;
                    local_1328 = auVar70._0_32_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_14e0 = k;
                      (*pGVar8->occlusionFilterN)(&args);
                      auVar70 = ZEXT3264(local_1328);
                      auVar69 = ZEXT3264(local_1308);
                      auVar68 = ZEXT3264(local_12e8);
                      auVar67 = ZEXT3264(local_12c8);
                      auVar66 = ZEXT3264(local_12a8);
                      auVar65 = ZEXT3264(local_1288);
                      k = local_14e0;
                    }
                    auVar41._8_8_ = uStack_14f0;
                    auVar41._0_8_ = local_14f8;
                    uVar27 = vptestmd_avx512vl(auVar41,auVar41);
                    if ((uVar27 & 0xf) == 0) {
                      bVar25 = true;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&args);
                        auVar70 = ZEXT3264(local_1328);
                        auVar69 = ZEXT3264(local_1308);
                        auVar68 = ZEXT3264(local_12e8);
                        auVar67 = ZEXT3264(local_12c8);
                        auVar66 = ZEXT3264(local_12a8);
                        auVar65 = ZEXT3264(local_1288);
                      }
                      auVar42._8_8_ = uStack_14f0;
                      auVar42._0_8_ = local_14f8;
                      uVar27 = vptestmd_avx512vl(auVar42,auVar42);
                      uVar27 = uVar27 & 0xf;
                      auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar25 = (bool)((byte)uVar27 & 1);
                      auVar43._0_4_ =
                           (uint)bVar25 * auVar50._0_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x80);
                      bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar43._4_4_ =
                           (uint)bVar25 * auVar50._4_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x84);
                      bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar43._8_4_ =
                           (uint)bVar25 * auVar50._8_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x88);
                      bVar25 = SUB81(uVar27 >> 3,0);
                      auVar43._12_4_ =
                           (uint)bVar25 * auVar50._12_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x8c)
                      ;
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar43;
                      bVar25 = (byte)uVar27 == 0;
                    }
                    if (bVar25) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar5;
                      uVar21 = uVar21 ^ 1L << (uVar14 & 0x3f);
                    }
                  }
                  if (!bVar25) {
                    if (bVar24) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar23 = 1;
                    }
                    goto LAB_00842720;
                  }
                } while (uVar21 != 0);
              }
            }
          }
          local_14d0 = local_14d0 + 1;
          bVar24 = local_14d0 < local_14d8;
        } while (local_14d0 != local_14d8);
      }
    }
LAB_00842720:
  } while ((uVar23 & 3) == 0);
  return local_14c8 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }